

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

void __thiscall
kj::MainBuilder::MainImpl::wrapText
          (MainImpl *this,Vector<char> *output,StringPtr indent,StringPtr text)

{
  uint uVar1;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  StringPtr local_60;
  ArrayPtr<const_char> local_50;
  StringPtr indent_local;
  ulong uVar2;
  
  local_60.content.size_ = text.content.size_;
  local_60.content.ptr = text.content.ptr;
  indent_local.content.size_ = indent.content.size_;
  indent_local.content.ptr = indent.content.ptr;
  uVar1 = 0x51 - (int)indent.content.size_;
  uVar2 = (ulong)uVar1;
  do {
    while( true ) {
      if (local_60.content.size_ == 1) {
        return;
      }
      Vector<char>::addAll<kj::StringPtr&>(output,&indent_local);
      StringPtr::findFirst((StringPtr *)&local_50,(char)&local_60);
      if (((char)local_50.ptr != '\x01') || (uVar2 < local_50.size_)) break;
      uVar5 = local_50.size_ + 1;
      local_50.ptr = local_60.content.ptr;
      local_50.size_ = uVar5;
      Vector<char>::addAll<kj::ArrayPtr<char_const>>(output,&local_50);
      local_60.content.ptr = local_60.content.ptr + uVar5;
      local_60.content.size_ = local_60.content.size_ - uVar5;
    }
    uVar5 = uVar2;
    if (local_60.content.size_ - 1 <= uVar2) {
      Vector<char>::addAll<kj::StringPtr&>(output,&local_60);
      local_50.ptr = (char *)CONCAT71(local_50.ptr._1_7_,10);
      Vector<char>::add<char>(output,(char *)&local_50);
      return;
    }
    do {
      uVar4 = uVar5;
      if (uVar4 == 0) {
        uVar4 = (ulong)uVar1;
        local_50.size_ = uVar2;
        goto LAB_00181f89;
      }
      uVar5 = uVar4 - 1;
    } while ((local_60.content.ptr[uVar4] != ' ') || (local_60.content.ptr[(int)uVar4 - 1] == ' '));
    local_50.size_ = uVar4 & 0xffffffff;
LAB_00181f89:
    local_50.ptr = local_60.content.ptr;
    Vector<char>::addAll<kj::ArrayPtr<char_const>>(output,&local_50);
    local_50.ptr = (char *)CONCAT71(local_50.ptr._1_7_,10);
    Vector<char>::add<char>(output,(char *)&local_50);
    do {
      uVar5 = uVar4 & 0xffffffff;
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (local_60.content.ptr[uVar5] == ' ');
    uVar5 = (ulong)(((local_60.content.ptr[uVar5] == '\n') + uVar3) - 1);
    local_60.content.ptr = local_60.content.ptr + uVar5;
    local_60.content.size_ = local_60.content.size_ - uVar5;
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::wrapText(Vector<char>& output, StringPtr indent, StringPtr text) {
  uint width = 80 - indent.size();

  while (text.size() > 0) {
    output.addAll(indent);

    KJ_IF_MAYBE(lineEnd, text.findFirst('\n')) {
      if (*lineEnd <= width) {
        output.addAll(text.slice(0, *lineEnd + 1));
        text = text.slice(*lineEnd + 1);
        continue;
      }
    }

    if (text.size() <= width) {
      output.addAll(text);
      output.add('\n');
      break;
    }

    uint wrapPos = width;
    for (;; wrapPos--) {
      if (wrapPos == 0) {
        // Hmm, no good place to break words.  Just break in the middle.
        wrapPos = width;
        break;
      } else if (text[wrapPos] == ' ' && text[wrapPos - 1] != ' ') {
        // This position is a space and is preceded by a non-space.  Wrap here.
        break;
      }
    }

    output.addAll(text.slice(0, wrapPos));
    output.add('\n');

    // Skip spaces after the text that was printed.
    while (text[wrapPos] == ' ') {
      ++wrapPos;
    }
    if (text[wrapPos] == '\n') {
      // Huh, apparently there were a whole bunch of spaces at the end of the line followed by a
      // newline.  Skip the newline as well so we don't print a blank line.
      ++wrapPos;
    }
    text = text.slice(wrapPos);
  }
}